

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O0

MultisampleConstPixelBufferAccess *
rr::MultisampleConstPixelBufferAccess::fromSinglesampleAccess
          (MultisampleConstPixelBufferAccess *__return_storage_ptr__,
          ConstPixelBufferAccess *original)

{
  int iVar1;
  int iVar2;
  int z_;
  TextureFormat *format;
  void *data;
  Vector<int,_3> local_58;
  Vector<int,_3> local_4c;
  ConstPixelBufferAccess local_40;
  ConstPixelBufferAccess *local_18;
  ConstPixelBufferAccess *original_local;
  
  local_18 = original;
  original_local = &__return_storage_ptr__->m_access;
  format = tcu::ConstPixelBufferAccess::getFormat(original);
  iVar1 = tcu::ConstPixelBufferAccess::getWidth(local_18);
  iVar2 = tcu::ConstPixelBufferAccess::getHeight(local_18);
  tcu::Vector<int,_3>::Vector(&local_4c,1,iVar1,iVar2);
  iVar1 = tcu::ConstPixelBufferAccess::getPixelPitch(local_18);
  iVar2 = tcu::ConstPixelBufferAccess::getPixelPitch(local_18);
  z_ = tcu::ConstPixelBufferAccess::getRowPitch(local_18);
  tcu::Vector<int,_3>::Vector(&local_58,iVar1,iVar2,z_);
  data = tcu::ConstPixelBufferAccess::getDataPtr(local_18);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_40,format,&local_4c,&local_58,data);
  MultisampleConstPixelBufferAccess(__return_storage_ptr__,&local_40);
  return __return_storage_ptr__;
}

Assistant:

MultisampleConstPixelBufferAccess MultisampleConstPixelBufferAccess::fromSinglesampleAccess (const tcu::ConstPixelBufferAccess& original)
{
	return MultisampleConstPixelBufferAccess(
				tcu::ConstPixelBufferAccess(
								original.getFormat(),
								tcu::IVec3(1, original.getWidth(), original.getHeight()),
								tcu::IVec3(original.getPixelPitch(), original.getPixelPitch(), original.getRowPitch()),
								original.getDataPtr()));
}